

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

void nni_listener_destroy(nni_listener *l)

{
  nni_aio_fini(&l->l_acc_aio);
  nni_aio_fini(&l->l_tmo_aio);
  if (l->l_data != (void *)0x0) {
    (*(l->l_ops).l_fini)(l->l_data);
  }
  nni_url_fini(&l->l_url);
  nni_free(l,(l->l_ops).l_size + 0x858);
  return;
}

Assistant:

void
nni_listener_destroy(nni_listener *l)
{
	// NB: both these will have already been stopped.
	nni_aio_fini(&l->l_acc_aio);
	nni_aio_fini(&l->l_tmo_aio);

	if (l->l_data != NULL) {
		l->l_ops.l_fini(l->l_data);
	}
	nni_url_fini(&l->l_url);
	nni_free(l, NNI_ALIGN_UP(sizeof(*l)) + l->l_ops.l_size);
}